

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O0

void fill_advent_calendar(level *lev,boolean init)

{
  char let;
  int iVar1;
  int iVar2;
  int local_38;
  int local_34;
  int object;
  int out_y;
  int out_x;
  int in_y;
  int in_x;
  int y;
  int x;
  char buf [4];
  int door_nr;
  boolean init_local;
  level *lev_local;
  
  x = 1;
  buf[3] = init;
  for (in_x = 1; in_x < 0x50; in_x = in_x + 1) {
    for (in_y = 1; in_y < 0x15; in_y = in_y + 1) {
      if (((((x < 0x19) && (0 < in_x)) && (in_x < 0x50)) && ((-1 < in_y && (in_y < 0x15)))) &&
         (lev->locations[in_x][in_y].typ == '\x17')) {
        if (in_y < 10) {
          local_34 = in_y + 1;
          out_y = in_y + -1;
        }
        else {
          local_34 = in_y + -1;
          out_y = in_y + 1;
        }
        if (buf[3] != '\0') {
          sprintf((char *)&y,"%d",(ulong)(uint)x);
          make_engr_at(lev,in_x,local_34,(char *)&y,0,'\x04');
          if (x == 0x18) {
            local_38 = 0x121;
            iVar1 = rn2(0xf);
            switch(iVar1) {
            case 0:
              local_38 = 0xe0;
              break;
            case 1:
              local_38 = 0xdf;
              break;
            case 2:
              local_38 = 0x100;
              break;
            case 3:
              local_38 = 0xff;
              break;
            case 4:
              local_38 = 0xfd;
              break;
            case 5:
              local_38 = 0x103;
              break;
            case 6:
              local_38 = 0x107;
              break;
            case 7:
              local_38 = 0xfb;
              break;
            case 8:
              local_38 = 0xe9;
              break;
            case 9:
              local_38 = 0x10a;
              break;
            case 10:
              local_38 = 0xe1;
              break;
            case 0xb:
              local_38 = 0xea;
              break;
            case 0xc:
              local_38 = 0x101;
              break;
            case 0xd:
              local_38 = 0xf2;
              break;
            case 0xe:
              local_38 = 0xf3;
            }
            mksobj_at(local_38,lev,in_x,out_y,'\x01','\x01');
          }
          else {
            iVar1 = rn2(4);
            if (iVar1 == 0) {
              iVar1 = rn2(4);
              let = '\x06';
              if (iVar1 != 0) {
                let = '\x04';
              }
              mkobj_at(let,lev,in_x,out_y,'\0');
            }
            else {
              iVar2 = rn2(4);
              iVar1 = 0x122;
              if (iVar2 != 0) {
                iVar1 = 0x121;
              }
              mksobj_at(iVar1,lev,in_x,out_y,'\0','\0');
            }
          }
        }
        if (((*(uint *)&lev->locations[in_x][in_y].field_0x6 >> 4 & 8) != 0) &&
           (iVar1 = getmonth(), iVar1 == 0xc)) {
          iVar1 = getmday();
          if ((iVar1 == 0x18) && (x == 0x18)) {
            You_hear("a little bell ringing!");
            *(uint *)&lev->locations[in_x][in_y].field_0x6 =
                 *(uint *)&lev->locations[in_x][in_y].field_0x6 & 0xfffffe0f | 0x40;
          }
          else {
            iVar1 = getmday();
            if (iVar1 == x) {
              You_hear("a door unlocking!");
              *(uint *)&lev->locations[in_x][in_y].field_0x6 =
                   *(uint *)&lev->locations[in_x][in_y].field_0x6 & 0xfffffe0f | 0x40;
            }
          }
        }
        x = x + 1;
      }
    }
  }
  return;
}

Assistant:

void fill_advent_calendar(struct level *lev, boolean init)
{
    int door_nr = 1;
    char buf[4];
    int x, y;
    int in_x, in_y, out_x, out_y;

    for (x = 1; x < COLNO; x++) {
	for (y = 1; y < ROWNO; y++) {
	    if (door_nr < 25 && isok(x,y) && IS_DOOR(lev->locations[x][y].typ)) {
		if (y < 10) {
		    out_x = x; out_y = y+1; in_x = x; in_y = y-1;
		} else {
		    out_x = x; out_y = y-1; in_x = x; in_y = y+1;
		}
		if (init) {
		    sprintf(buf, "%d", door_nr);
		    /* place number in front of the door */
		    make_engr_at(lev, out_x, out_y, buf, 0L, MARK);
		    if (door_nr == 24) {
			int object = CANDY_BAR;
			/* Christmas present! */
			switch (rn2(15)) {
			case  0: object = BAG_OF_HOLDING; break;
			case  1: object = OILSKIN_SACK; break;
			case  2: object = FIRE_HORN; break;
			case  3: object = FROST_HORN; break;
			case  4: object = MAGIC_FLUTE; break;
			case  5: object = MAGIC_HARP; break;
			case  6: object = DRUM_OF_EARTHQUAKE; break;
			case  7: object = MAGIC_WHISTLE; break;
			case  8: object = MAGIC_LAMP; break;
			case  9: object = UNICORN_HORN; break;
			case 10: object = BAG_OF_TRICKS; break;
			case 11: object = EXPENSIVE_CAMERA; break;
			case 12: object = HORN_OF_PLENTY; break;
			case 13: object = STETHOSCOPE; break;
			case 14: object = TINNING_KIT; break;
			}
			mksobj_at(object, lev, in_x, in_y, TRUE, TRUE);
		    } else if (rn2(4)) {
			mksobj_at((rn2(4)) ? CANDY_BAR : FORTUNE_COOKIE,
				  lev, in_x, in_y, FALSE, FALSE);
		    } else {
			mkobj_at((rn2(4)) ? RING_CLASS : TOOL_CLASS,
				 lev, in_x, in_y, FALSE);
		    }
		}
		if (lev->locations[x][y].doormask & D_LOCKED && getmonth() == 12) {
		    if (getmday() == 24 && door_nr == 24) {
			You_hear("a little bell ringing!");
			lev->locations[x][y].doormask = D_CLOSED;
		    } else if (getmday() == door_nr) {
			You_hear("a door unlocking!");
			lev->locations[x][y].doormask = D_CLOSED;
		    }
		}
		door_nr++;
	    }
	}
    }
}